

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O1

target_ulong_conflict
helper_mftc0_configx_mipsel(CPUMIPSState_conflict2 *env,target_ulong_conflict idx)

{
  target_ulong_conflict tVar1;
  
  tVar1 = 0;
  switch(idx) {
  case 0:
    return env->CP0_Config0;
  case 1:
    return env->CP0_Config1;
  case 2:
    return env->CP0_Config2;
  case 3:
    return env->CP0_Config3;
  case 6:
    return env->CP0_Config6;
  case 7:
    tVar1 = env->CP0_Config7;
  }
  return tVar1;
}

Assistant:

target_ulong helper_mftc0_configx(CPUMIPSState *env, target_ulong idx)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    switch (idx) {
    case 0: return other->CP0_Config0;
    case 1: return other->CP0_Config1;
    case 2: return other->CP0_Config2;
    case 3: return other->CP0_Config3;
    /* 4 and 5 are reserved.  */
    case 6: return other->CP0_Config6;
    case 7: return other->CP0_Config7;
    default:
        break;
    }
    return 0;
}